

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

void __thiscall
Assimp::FBX::FBXConverter::ConvertCamera(FBXConverter *this,Camera *cam,string *orig_name)

{
  pointer *pppaVar1;
  iterator __position;
  ulong __n;
  aiCamera *paVar2;
  float fVar3;
  float fVar4;
  aiCamera *local_30;
  
  paVar2 = (aiCamera *)operator_new(0x438);
  (paVar2->mName).length = 0;
  (paVar2->mName).data[0] = '\0';
  memset((paVar2->mName).data + 1,0x1b,0x3ff);
  (paVar2->mPosition).x = 0.0;
  (paVar2->mPosition).y = 0.0;
  *(undefined8 *)&(paVar2->mPosition).z = 0;
  (paVar2->mUp).y = 1.0;
  (paVar2->mUp).z = 0.0;
  (paVar2->mLookAt).x = 0.0;
  (paVar2->mLookAt).y = 0.0;
  *(undefined8 *)&(paVar2->mLookAt).z = 0x3f490fdb3f800000;
  paVar2->mClipPlaneNear = 0.1;
  paVar2->mClipPlaneFar = 1000.0;
  paVar2->mAspect = 0.0;
  __position._M_current =
       (this->cameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_30 = paVar2;
  if (__position._M_current ==
      (this->cameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiCamera*,std::allocator<aiCamera*>>::_M_realloc_insert<aiCamera*>
              ((vector<aiCamera*,std::allocator<aiCamera*>> *)&this->cameras,__position,&local_30);
  }
  else {
    *__position._M_current = paVar2;
    pppaVar1 = &(this->cameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppaVar1 = *pppaVar1 + 1;
  }
  paVar2 = (this->cameras).super__Vector_base<aiCamera_*,_std::allocator<aiCamera_*>_>._M_impl.
           super__Vector_impl_data._M_finish[-1];
  __n = orig_name->_M_string_length;
  if (__n < 0x400) {
    (paVar2->mName).length = (ai_uint32)__n;
    memcpy((paVar2->mName).data,(orig_name->_M_dataplus)._M_p,__n);
    (paVar2->mName).data[__n] = '\0';
  }
  fVar3 = Camera::AspectWidth(cam);
  fVar4 = Camera::AspectHeight(cam);
  paVar2->mAspect = fVar3 / fVar4;
  (paVar2->mPosition).x = 0.0;
  (paVar2->mPosition).y = 0.0;
  (paVar2->mPosition).z = 0.0;
  (paVar2->mLookAt).x = 1.0;
  (paVar2->mLookAt).y = 0.0;
  (paVar2->mLookAt).z = 0.0;
  (paVar2->mUp).x = 0.0;
  (paVar2->mUp).y = 1.0;
  (paVar2->mUp).z = 0.0;
  fVar3 = Camera::FieldOfView(cam);
  paVar2->mHorizontalFOV = fVar3 * 0.017453292;
  fVar3 = Camera::NearPlane(cam);
  paVar2->mClipPlaneNear = fVar3;
  fVar3 = Camera::FarPlane(cam);
  paVar2->mClipPlaneFar = fVar3;
  fVar3 = Camera::FieldOfView(cam);
  paVar2->mHorizontalFOV = fVar3 * 0.017453292;
  fVar3 = Camera::NearPlane(cam);
  paVar2->mClipPlaneNear = fVar3;
  fVar3 = Camera::FarPlane(cam);
  paVar2->mClipPlaneFar = fVar3;
  return;
}

Assistant:

void FBXConverter::ConvertCamera(const Camera& cam, const std::string &orig_name)
        {
            cameras.push_back(new aiCamera());
            aiCamera* const out_camera = cameras.back();

            out_camera->mName.Set(orig_name);

            out_camera->mAspect = cam.AspectWidth() / cam.AspectHeight();

            out_camera->mPosition = aiVector3D(0.0f);
            out_camera->mLookAt = aiVector3D(1.0f, 0.0f, 0.0f);
            out_camera->mUp = aiVector3D(0.0f, 1.0f, 0.0f);

            out_camera->mHorizontalFOV = AI_DEG_TO_RAD(cam.FieldOfView());

            out_camera->mClipPlaneNear = cam.NearPlane();
            out_camera->mClipPlaneFar = cam.FarPlane();

            out_camera->mHorizontalFOV = AI_DEG_TO_RAD(cam.FieldOfView());
            out_camera->mClipPlaneNear = cam.NearPlane();
            out_camera->mClipPlaneFar = cam.FarPlane();
        }